

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O0

void __thiscall FNodeBuilder::RemoveSegFromVert2(FNodeBuilder *this,DWORD segnum,int vertnum)

{
  DWORD DVar1;
  FPrivVert *pFVar2;
  FPrivSeg *pFVar3;
  uint local_28;
  uint local_24;
  DWORD curr;
  DWORD prev;
  FPrivVert *v;
  int vertnum_local;
  DWORD segnum_local;
  FNodeBuilder *this_local;
  
  pFVar2 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)vertnum);
  if (pFVar2->segs2 == segnum) {
    pFVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)segnum);
    pFVar2->segs2 = pFVar3->nextforvert2;
  }
  else {
    local_24 = 0;
    local_28 = pFVar2->segs2;
    while (local_28 != 0xffffffff && local_28 != segnum) {
      local_24 = local_28;
      pFVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)local_28);
      local_28 = pFVar3->nextforvert2;
    }
    if (local_28 == segnum) {
      pFVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)local_28);
      DVar1 = pFVar3->nextforvert2;
      pFVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                         (&this->Segs,(ulong)local_24);
      pFVar3->nextforvert2 = DVar1;
    }
  }
  return;
}

Assistant:

void FNodeBuilder::RemoveSegFromVert2 (DWORD segnum, int vertnum)
{
	FPrivVert *v = &Vertices[vertnum];

	if (v->segs2 == segnum)
	{
		v->segs2 = Segs[segnum].nextforvert2;
	}
	else
	{
		DWORD prev, curr;
		prev = 0;
		curr = v->segs2;
		while (curr != DWORD_MAX && curr != segnum)
		{
			prev = curr;
			curr = Segs[curr].nextforvert2;
		}
		if (curr == segnum)
		{
			Segs[prev].nextforvert2 = Segs[curr].nextforvert2;
		}
	}
}